

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Vec_Int_t *
Wlc_NtkGetCoreSels(Gia_Man_t *pFrames,int nFrames,int first_sel_pi,int num_sel_pis,Vec_Bit_t *vMark,
                  int nConfLimit,Wlc_Par_t *pPars,int fSetPO,int RunId)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar4;
  sat_solver *psVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  lit *begin;
  uint *__ptr;
  void *__s;
  int *piVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  ulong uVar11;
  char *format;
  sat_solver *psVar12;
  ulong uVar13;
  int Lit;
  int local_64;
  sat_solver *local_60;
  Vec_Int_t *local_58;
  uint local_4c;
  uint *local_48;
  ulong local_40;
  long local_38;
  
  local_38 = CONCAT44(in_register_0000000c,num_sel_pis);
  local_4c = first_sel_pi;
  pAig = Gia_ManToAigSimple(pFrames);
  pCVar4 = Cnf_Derive(pAig,pAig->nObjs[3]);
  psVar5 = sat_solver_new();
  sat_solver_setnvars(psVar5,pCVar4->nVars);
  if (-1 < (int)vMark) {
    psVar5->RunId = (int)vMark;
    psVar5->pFuncStop = Wla_CallBackToStop;
  }
  lVar10 = 0;
  while (lVar10 < pCVar4->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCVar4->pClauses[lVar10],pCVar4->pClauses[lVar10 + 1]);
    lVar10 = lVar10 + 1;
    if (iVar2 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                    ,0xea,
                    "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                   );
    }
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  pVVar8 = pAig->vCos;
  if (pVVar8->nSize < 1) {
    lVar10 = 0;
  }
  else {
    lVar10 = 0;
    do {
      if (pCVar4->pVarNums[*(int *)((long)pVVar8->pArray[lVar10] + 0x24)] < 0) {
        __assert_fail("pCnf->pVarNums[pObj->Id] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                      ,0xf3,
                      "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                     );
      }
      Vec_IntPush(pVVar6,pCVar4->pVarNums[*(int *)((long)pVVar8->pArray[lVar10] + 0x24)] * 2);
      lVar10 = lVar10 + 1;
      pVVar8 = pAig->vCos;
    } while (lVar10 < pVVar8->nSize);
    piVar7 = pVVar6->pArray;
    lVar10 = (long)pVVar6->nSize;
  }
  psVar12 = psVar5;
  iVar2 = sat_solver_addclause(psVar5,piVar7,piVar7 + lVar10);
  if (iVar2 == 0) {
    Abc_Print((int)psVar12,"UNSAT after adding PO clauses.\n");
  }
  if (piVar7 != (lit *)0x0) {
    free(piVar7);
  }
  free(pVVar6);
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  begin = (lit *)malloc(400);
  pVVar6->pArray = begin;
  uVar1 = pCVar4->nVars;
  local_58 = pVVar6;
  __ptr = (uint *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar3 = uVar1;
  }
  *__ptr = uVar3;
  if (uVar3 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    __ptr[1] = uVar1;
LAB_008a845b:
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar3 << 2);
    *(void **)(__ptr + 2) = __s;
    __ptr[1] = uVar1;
    if (__s == (void *)0x0) goto LAB_008a845b;
    memset(__s,0,(long)(int)uVar1 << 2);
  }
  local_60 = psVar5;
  if ((int)local_4c < 1) {
    lVar10 = 0;
  }
  else {
    uVar13 = (ulong)local_4c;
    uVar11 = 0;
    local_48 = __ptr;
    local_40 = (ulong)uVar1;
    do {
      if ((nFrames < 0) || ((long)pAig->vCis->nSize <= (long)((long)nFrames + uVar11))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = pCVar4->pVarNums[*(int *)((long)pAig->vCis->pArray[(long)nFrames + uVar11] + 0x24)];
      if ((long)iVar2 < 0) {
        __assert_fail("var >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcAbs.c"
                      ,0x118,
                      "Vec_Int_t *Wlc_NtkGetCoreSels(Gia_Man_t *, int, int, int, Vec_Bit_t *, int, Wlc_Par_t *, int, int)"
                     );
      }
      if ((int)local_40 <= iVar2) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(uint *)((long)__s + (long)iVar2 * 4) = (uint)uVar11;
      local_64 = iVar2 * 2;
      if ((long)*(int *)(local_38 + 4) <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      if ((*(uint *)(*(long *)(local_38 + 8) + (uVar11 >> 5 & 0x7ffffff) * 4) >>
           ((uint)uVar11 & 0x1f) & 1) == 0) {
        sat_solver_addclause(local_60,&local_64,(lit *)&local_60);
      }
      else {
        Vec_IntPush(local_58,local_64);
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
    begin = local_58->pArray;
    lVar10 = (long)local_58->nSize;
    __ptr = local_48;
  }
  psVar5 = local_60;
  psVar12 = local_60;
  iVar2 = sat_solver_solve(local_60,begin,begin + lVar10,0,0,0,0);
  if (iVar2 == 1) {
    format = "SAT.\n";
  }
  else {
    if (iVar2 == -1) {
      piVar9 = (int *)0x0;
      Abc_Print((int)psVar12,"UNSAT.\n");
      uVar1 = (psVar5->conf_final).size;
      piVar7 = (psVar5->conf_final).ptr;
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      uVar3 = 0x10;
      if (0xe < uVar1 - 1) {
        uVar3 = uVar1;
      }
      pVVar6->nSize = 0;
      pVVar6->nCap = uVar3;
      if (uVar3 != 0) {
        piVar9 = (int *)malloc((long)(int)uVar3 << 2);
      }
      pVVar6->pArray = piVar9;
      if (0 < (int)uVar1) {
        uVar11 = 0;
        do {
          uVar3 = piVar7[uVar11] >> 1;
          if (((int)uVar3 < 0) || ((int)__ptr[1] <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(pVVar6,*(int *)(*(long *)(__ptr + 2) + (ulong)uVar3 * 4));
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
      goto LAB_008a8649;
    }
    format = "UNKNOWN.\n";
  }
  pVVar6 = (Vec_Int_t *)0x0;
  Abc_Print((int)psVar12,format);
LAB_008a8649:
  if (begin != (lit *)0x0) {
    free(begin);
  }
  free(local_58);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  Cnf_ManFree();
  sat_solver_delete(local_60);
  Aig_ManStop(pAig);
  return pVVar6;
}

Assistant:

static Vec_Int_t * Wlc_NtkGetCoreSels( Gia_Man_t * pFrames, int nFrames, int first_sel_pi, int num_sel_pis, Vec_Bit_t * vMark, int nConfLimit, Wlc_Par_t * pPars, int fSetPO, int RunId ) 
{
    Vec_Int_t * vCores = NULL;
    Aig_Man_t * pAigFrames = Gia_ManToAigSimple( pFrames );
    Cnf_Dat_t * pCnf = Cnf_Derive(pAigFrames, Aig_ManCoNum(pAigFrames));
    sat_solver * pSat = sat_solver_new();
    int i;

    sat_solver_setnvars(pSat, pCnf->nVars);
    if ( RunId >= 0 )
    {
        sat_solver_set_runid( pSat, RunId );
        sat_solver_set_stop_func( pSat, Wla_CallBackToStop );
    }

    for (i = 0; i < pCnf->nClauses; i++) 
    {
        if (!sat_solver_addclause(pSat, pCnf->pClauses[i], pCnf->pClauses[i + 1]))
            assert(false);
    }
    // add PO clauses
    {
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Aig_Obj_t* pObj;
        int i, ret;
        Aig_ManForEachCo( pAigFrames, pObj, i )
        {
            assert(pCnf->pVarNums[pObj->Id] >= 0);
            Vec_IntPush(vLits, toLitCond(pCnf->pVarNums[pObj->Id], 0));
        }
        if ( !fSetPO )
        {
            ret = sat_solver_addclause(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits));
            if (!ret) 
                Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
        }
        else
        {
            int Lit;
            for ( i = 0; i < Vec_IntSize(vLits); ++i )
            {
                if ( i == Vec_IntSize(vLits) - 1 )
                    Lit = Vec_IntEntry( vLits, i );
                else
                    Lit = lit_neg(Vec_IntEntry( vLits, i ));
                ret = sat_solver_addclause(pSat, &Lit, &Lit + 1);
                if (!ret) 
                    Abc_Print( 1, "UNSAT after adding PO clauses.\n" );
            }
        }

        Vec_IntFree(vLits);
    }
    
    // main procedure
    {
        int status;
        Vec_Int_t* vLits = Vec_IntAlloc(100);
        Vec_Int_t* vMapVar2Sel = Vec_IntStart( pCnf->nVars );
        for ( i = 0; i < num_sel_pis; ++i ) 
        {
            int cur_pi = first_sel_pi + i;
            int var = pCnf->pVarNums[Aig_ManCi(pAigFrames, cur_pi)->Id];
            int Lit;
            assert(var >= 0);
            Vec_IntWriteEntry( vMapVar2Sel, var, i );
            Lit = toLitCond( var, 0 );
            if ( Vec_BitEntry( vMark, i ) )
                Vec_IntPush(vLits, Lit);
            else
                sat_solver_addclause( pSat, &Lit, &Lit+1 );
        }
        /*
            int i, Entry;
            Abc_Print( 1, "#vLits = %d; vLits = ", Vec_IntSize(vLits) );
            Vec_IntForEachEntry(vLits, Entry, i)
                Abc_Print( 1, "%d ", Entry);
            Abc_Print( 1, "\n");
        */
        status = sat_solver_solve(pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)(nConfLimit), (ABC_INT64_T)(0), (ABC_INT64_T)(0), (ABC_INT64_T)(0));
        if (status == l_False) {
            int nCoreLits, *pCoreLits;
            Abc_Print( 1, "UNSAT.\n" );
            nCoreLits = sat_solver_final(pSat, &pCoreLits);
            vCores = Vec_IntAlloc( nCoreLits );
            for (i = 0; i < nCoreLits; i++) 
            {
                Vec_IntPush( vCores, Vec_IntEntry( vMapVar2Sel, lit_var( pCoreLits[i] ) ) );
            }
        } else if (status == l_True) {
            Abc_Print( 1, "SAT.\n" );
        } else {
            Abc_Print( 1, "UNKNOWN.\n" );
        }

        Vec_IntFree(vLits);
        Vec_IntFree(vMapVar2Sel);
    }
    Cnf_ManFree();
    sat_solver_delete(pSat);
    Aig_ManStop(pAigFrames);

    return vCores;
}